

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool checkprotoprefix(SessionHandle *data,connectdata *conn,char *s)

{
  char *s_local;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  if ((conn->handler->protocol & 0x40000) == 0) {
    data_local._7_1_ = checkhttpprefix(data,s);
  }
  else {
    data_local._7_1_ = checkrtspprefix(data,s);
  }
  return data_local._7_1_;
}

Assistant:

static bool
checkprotoprefix(struct SessionHandle *data, struct connectdata *conn,
                 const char *s)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s);
}